

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O2

void __thiscall
TasGrid::TasmanianSparseGrid::getNeededPoints
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *x)

{
  long lVar1;
  size_type __new_size;
  
  lVar1 = *(long *)(this + 8);
  if (lVar1 == 0) {
    __new_size = 0;
  }
  else {
    __new_size = (long)*(int *)(lVar1 + 0x48) * (long)*(int *)(lVar1 + 0x10);
  }
  std::vector<double,_std::allocator<double>_>::resize(x,__new_size);
  TasGrid::TasmanianSparseGrid::getNeededPoints((double *)this);
  return;
}

Assistant:

void getNeededPoints(std::vector<double> &x) const{ x.resize(Utils::size_mult(getNumDimensions(), getNumNeeded())); getNeededPoints(x.data()); }